

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-decimal128.c
# Opt level: O2

_Bool bson_decimal128_from_string(char *string,bson_decimal128_t *dec)

{
  char cVar1;
  ushort *puVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  ushort **ppuVar6;
  uint16_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  undefined8 unaff_R12;
  undefined8 uVar19;
  ulong uVar20;
  ushort uVar21;
  char *pcVar22;
  bool bVar23;
  int local_a4;
  undefined8 local_a0;
  ushort auStack_98 [2];
  int nread;
  long local_90;
  long local_88;
  char *local_80;
  uint16_t digits [34];
  
  digits[0x18] = 0;
  digits[0x19] = 0;
  digits[0x1a] = 0;
  digits[0x1b] = 0;
  digits[0x1c] = 0;
  digits[0x1d] = 0;
  digits[0x1e] = 0;
  digits[0x1f] = 0;
  digits[0x10] = 0;
  digits[0x11] = 0;
  digits[0x12] = 0;
  digits[0x13] = 0;
  digits[0x14] = 0;
  digits[0x15] = 0;
  digits[0x16] = 0;
  digits[0x17] = 0;
  digits[8] = 0;
  digits[9] = 0;
  digits[10] = 0;
  digits[0xb] = 0;
  digits[0xc] = 0;
  digits[0xd] = 0;
  digits[0xe] = 0;
  digits[0xf] = 0;
  digits[0] = 0;
  digits[1] = 0;
  digits[2] = 0;
  digits[3] = 0;
  digits[4] = 0;
  digits[5] = 0;
  digits[6] = 0;
  digits[7] = 0;
  digits[0x20] = 0;
  digits[0x21] = 0;
  local_a4 = 0;
  if (dec == (bson_decimal128_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-decimal128.c"
            ,0x1d9,"bson_decimal128_from_string","dec");
    abort();
  }
  dec->low = 0;
  dec->high = 0;
  cVar1 = *string;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    uVar19 = CONCAT71((int7)((ulong)unaff_R12 >> 8),cVar1 == '-');
    cVar1 = string[1];
    lVar12 = 1;
    pcVar22 = string + 1;
  }
  else {
    uVar19 = 0;
    lVar12 = 0;
    pcVar22 = string;
  }
  ppuVar6 = __ctype_b_loc();
  puVar2 = *ppuVar6;
  if ((cVar1 != '.') && ((puVar2[cVar1] & 0x800) == 0)) {
    _Var4 = _dec128_istreq(pcVar22,"inf");
    if ((_Var4) || (_Var4 = _dec128_istreq(pcVar22,"infinity"), _Var4)) {
      dec->high = ((ulong)(byte)~(byte)uVar19 << 0x3f) + 0xf800000000000000;
      dec->low = 0;
      _Var4 = true;
    }
    else {
      _Var4 = _dec128_istreq(pcVar22,"nan");
      dec->high = 0x7c00000000000000;
      dec->low = 0;
    }
    return _Var4;
  }
  local_88 = lVar12;
  local_80 = string;
  puVar7 = digits;
  bVar3 = false;
  uVar20 = 0;
  uVar11 = 0;
  local_90 = 0;
  uVar21 = 0;
  lVar12 = 0;
  bVar16 = 0;
LAB_0010cd8f:
  uVar9 = (ulong)bVar16;
  lVar13 = 0;
  while( true ) {
    lVar14 = lVar12 + lVar13;
    bVar17 = pcVar22[lVar13];
    if (((long)(char)bVar17 != 0x2e) && ((puVar2[(char)bVar17] & 0x800) == 0)) break;
    if (bVar17 == 0x2e) goto LAB_0010ce0a;
    if ((uVar21 < 0x22) && ((bool)(bVar17 != 0x30 | bVar3))) {
      if (bVar3) {
        lVar14 = local_90;
      }
      if (bVar17 != 0x30) {
        local_90 = lVar14;
      }
      *puVar7 = (short)(char)bVar17 - 0x30;
      puVar7 = puVar7 + 1;
      uVar21 = uVar21 + 1;
      bVar3 = true;
    }
    uVar20 = uVar20 + bVar3;
    uVar11 = uVar11 + uVar9;
    lVar13 = lVar13 + 1;
  }
  if ((bVar16 != 0) && (lVar14 == 0)) goto LAB_0010ce85;
  local_a0 = uVar19;
  if ((bVar17 | 0x20) == 0x65) {
    nread = 0;
    iVar5 = __isoc99_sscanf(pcVar22 + lVar13 + 1,"%d%n",&local_a4,&nread);
    if (iVar5 == 0 || nread == 0) goto LAB_0010ce85;
    bVar17 = pcVar22[lVar13 + 1 + (long)nread];
  }
  if (bVar17 != 0) goto LAB_0010ce85;
  if (uVar21 == 0) {
    digits._0_8_ = digits._0_8_ & 0xffffffffffff0000;
    uVar10 = 0;
    uVar15 = 1;
    uVar8 = 0;
    uVar20 = uVar15;
  }
  else {
    uVar15 = (ulong)(uint)uVar21;
    uVar10 = uVar20 + 1;
    pcVar22 = local_80 + local_90 + uVar20 + uVar9 + local_88;
    do {
      pcVar22 = pcVar22 + -1;
      uVar10 = uVar10 - 1;
    } while (*pcVar22 == '0');
    uVar8 = (ulong)(uVar21 - 1);
  }
  iVar18 = local_a4 - (int)uVar11;
  iVar5 = -0x1820;
  if (uVar11 - (long)local_a4 < 0x4001) {
    iVar5 = iVar18;
  }
  if (uVar11 < (ulong)(long)local_a4) {
    iVar5 = iVar18;
  }
  do {
    if (iVar5 < 0x17e0) {
LAB_0010cf86:
      do {
        if ((-0x1821 < iVar5) && (uVar20 <= uVar15)) {
          if (uVar8 + 1 < uVar10) {
            if (local_80[uVar9 + 1 + local_88 + uVar8 + local_90] != '0') goto LAB_0010ce85;
          }
          else if (uVar10 == 0) {
            uVar11 = 0;
            uVar20 = 0;
            goto LAB_0010d099;
          }
          uVar11 = digits._0_8_ & 0xffff;
          if (uVar8 < 0x11) {
            uVar20 = uVar11;
            for (uVar9 = 0; uVar11 = 0, uVar8 != uVar9; uVar9 = uVar9 + 1) {
              uVar20 = (ulong)digits[uVar9 + 1] + uVar20 * 10;
            }
          }
          else {
            uVar9 = uVar8 - 0x10;
            for (uVar20 = 0x11; uVar8 != uVar20; uVar20 = uVar20 + 1) {
              uVar11 = (ulong)auStack_98[uVar20] + uVar11 * 10;
            }
            uVar20 = (ulong)auStack_98[uVar8];
            for (; uVar9 < uVar8; uVar9 = uVar9 + 1) {
              uVar20 = (ulong)digits[uVar9 + 1] + uVar20 * 10;
            }
          }
LAB_0010d099:
          uVar9 = (uVar11 >> 0x20) * 0x5d8a0000;
          uVar10 = (uVar11 & 0xffffffff) * 0x5d8a0000;
          uVar15 = (uVar10 >> 0x20) + (uVar9 & 0xffffffff) + (uVar11 & 0xffffffff) * 0x1634578;
          uVar10 = (uVar10 & 0xffffffff) + uVar20 + (uVar15 << 0x20);
          uVar20 = (uVar15 >> 0x20) + (uVar9 >> 0x20) + (uVar11 >> 0x20) * 0x1634578 +
                   (ulong)(uVar10 < uVar20);
          if ((uVar20 & 0x2000000000000) == 0) {
            uVar20 = uVar20 & 0x1ffffffffffff |
                     (ulong)(iVar5 + 0x1820U & 0x3fff) << 0x31 | dec->high;
          }
          else {
            uVar20 = (ulong)(iVar5 + 0x1820U & 0xffff) << 0x2f | dec->high | 0x6000000000000000 |
                     uVar20 & 0x7fffffffffff;
          }
          dec->high = uVar20;
          dec->low = uVar10;
          if ((char)local_a0 == '\0') {
            return true;
          }
          dec->high = uVar20 | 0x8000000000000000;
          return true;
        }
        if (uVar8 == 0) {
          if (uVar10 != 0) goto LAB_0010ce85;
          iVar5 = -0x1820;
          uVar20 = 0;
          uVar11 = 0;
          goto LAB_0010d099;
        }
        if (uVar15 < uVar20) {
          if ((uVar10 != 0) && (local_80[uVar20 + uVar9 + local_88 + -1] != '0')) goto LAB_0010ce85;
          uVar20 = uVar20 - 1;
        }
        else {
          if (digits[uVar8] != 0) goto LAB_0010ce85;
          uVar8 = uVar8 - 1;
        }
        if (0x17de < iVar5) goto LAB_0010ce85;
        iVar5 = iVar5 + 1;
      } while( true );
    }
    if (0x21 < uVar8) {
      if (uVar10 != 0) goto LAB_0010ce85;
      uVar8 = uVar8 + 1;
      iVar5 = 0x17df;
      goto LAB_0010cf86;
    }
    iVar5 = iVar5 + -1;
    uVar8 = uVar8 + 1;
  } while( true );
LAB_0010ce0a:
  pcVar22 = pcVar22 + lVar13 + 1;
  bVar23 = bVar16 != 0;
  lVar12 = lVar14;
  bVar16 = 1;
  if (bVar23) {
LAB_0010ce85:
    dec->high = 0x7c00000000000000;
    dec->low = 0;
    return false;
  }
  goto LAB_0010cd8f;
}

Assistant:

bool
bson_decimal128_from_string (const char *string,     /* IN */
                             bson_decimal128_t *dec) /* OUT */
{
   _bson_uint128_6464_t significand = {0};

   const char *str_read = string; /* Read pointer for consuming str. */

   /* Parsing state tracking */
   bool is_negative = false;
   bool saw_radix = false;
   bool includes_sign = false; /* True if the input string contains a sign. */
   bool found_nonzero = false;

   size_t significant_digits = 0; /* Total number of significant digits
                                   * (no leading or trailing zero) */
   size_t ndigits_read = 0;       /* Total number of significand digits read */
   size_t ndigits = 0;        /* Total number of digits (no leading zeros) */
   size_t radix_position = 0; /* The number of the digits after radix */
   size_t first_nonzero = 0;  /* The index of the first non-zero in *str* */

   uint16_t digits[BSON_DECIMAL128_MAX_DIGITS] = {0};
   uint16_t ndigits_stored = 0;      /* The number of digits in digits */
   uint16_t *digits_insert = digits; /* Insertion pointer for digits */
   size_t first_digit = 0;           /* The index of the first non-zero digit */
   size_t last_digit = 0;            /* The index of the last digit */

   int32_t exponent = 0;
   uint64_t significand_high = 0; /* The high 17 digits of the significand */
   uint64_t significand_low = 0;  /* The low 17 digits of the significand */
   uint16_t biased_exponent = 0;  /* The biased exponent */

   BSON_ASSERT (dec);
   dec->high = 0;
   dec->low = 0;

   if (*str_read == '+' || *str_read == '-') {
      is_negative = *(str_read++) == '-';
      includes_sign = true;
   }

   /* Check for Infinity or NaN */
   if (!isdigit (*str_read) && *str_read != '.') {
      if (_dec128_istreq (str_read, "inf") ||
          _dec128_istreq (str_read, "infinity")) {
         BSON_DECIMAL128_SET_INF (*dec, is_negative);
         return true;
      } else if (_dec128_istreq (str_read, "nan")) {
         BSON_DECIMAL128_SET_NAN (*dec);
         return true;
      }

      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Read digits */
   while (isdigit (*str_read) || *str_read == '.') {
      if (*str_read == '.') {
         if (saw_radix) {
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }

         saw_radix = true;
         str_read++;
         continue;
      }

      if (ndigits_stored < 34) {
         if (*str_read != '0' || found_nonzero) {
            if (!found_nonzero) {
               first_nonzero = ndigits_read;
            }

            found_nonzero = true;
            *(digits_insert++) = *(str_read) - '0'; /* Only store 34 digits */
            ndigits_stored++;
         }
      }

      if (found_nonzero) {
         ndigits++;
      }

      if (saw_radix) {
         radix_position++;
      }

      ndigits_read++;
      str_read++;
   }

   if (saw_radix && !ndigits_read) {
      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Read exponent if exists */
   if (*str_read == 'e' || *str_read == 'E') {
      int nread = 0;
#ifdef _MSC_VER
#define SSCANF sscanf_s
#else
#define SSCANF sscanf
#endif
      int read_exponent = SSCANF (++str_read, "%d%n", &exponent, &nread);
      str_read += nread;

      if (!read_exponent || nread == 0) {
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

#undef SSCANF
   }

   if (*str_read) {
      BSON_DECIMAL128_SET_NAN (*dec);
      return false;
   }

   /* Done reading input. */
   /* Find first non-zero digit in digits */
   first_digit = 0;

   if (!ndigits_stored) { /* value is zero */
      first_digit = 0;
      last_digit = 0;
      digits[0] = 0;
      ndigits = 1;
      ndigits_stored = 1;
      significant_digits = 0;
   } else {
      last_digit = ndigits_stored - 1;
      significant_digits = ndigits;
      /* Mark trailing zeros as non-significant */
      while (string[first_nonzero + significant_digits - 1 + includes_sign +
                    saw_radix] == '0') {
         significant_digits--;
      }
   }


   /* Normalization of exponent */
   /* Correct exponent based on radix position, and shift significand as needed
    */
   /* to represent user input */

   /* Overflow prevention */
   if (exponent <= radix_position && radix_position - exponent > (1 << 14)) {
      exponent = BSON_DECIMAL128_EXPONENT_MIN;
   } else {
      exponent -= radix_position;
   }

   /* Attempt to normalize the exponent */
   while (exponent > BSON_DECIMAL128_EXPONENT_MAX) {
      /* Shift exponent to significand and decrease */
      last_digit++;

      if (last_digit - first_digit > BSON_DECIMAL128_MAX_DIGITS) {
         /* The exponent is too great to shift into the significand. */
         if (significant_digits == 0) {
            /* Value is zero, we are allowed to clamp the exponent. */
            exponent = BSON_DECIMAL128_EXPONENT_MAX;
            break;
         }

         /* Overflow is not permitted, error. */
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

      exponent--;
   }

   while (exponent < BSON_DECIMAL128_EXPONENT_MIN || ndigits_stored < ndigits) {
      /* Shift last digit */
      if (last_digit == 0) {
         /* underflow is not allowed, but zero clamping is */
         if (significant_digits == 0) {
            exponent = BSON_DECIMAL128_EXPONENT_MIN;
            break;
         }

         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }

      if (ndigits_stored < ndigits) {
         if (string[ndigits - 1 + includes_sign + saw_radix] - '0' != 0 &&
             significant_digits != 0) {
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }

         ndigits--; /* adjust to match digits not stored */
      } else {
         if (digits[last_digit] != 0) {
            /* Inexact rounding is not allowed. */
            BSON_DECIMAL128_SET_NAN (*dec);
            return false;
         }


         last_digit--; /* adjust to round */
      }

      if (exponent < BSON_DECIMAL128_EXPONENT_MAX) {
         exponent++;
      } else {
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }
   }

   /* Round */
   /* We've normalized the exponent, but might still need to round. */
   if (last_digit - first_digit + 1 < significant_digits) {
      uint8_t round_digit;

      /* There are non-zero digits after last_digit that need rounding. */
      /* We round to nearest, ties to even */
      round_digit =
         string[first_nonzero + last_digit + includes_sign + saw_radix + 1] -
         '0';

      if (round_digit != 0) {
         /* Inexact (non-zero) rounding is not allowed */
         BSON_DECIMAL128_SET_NAN (*dec);
         return false;
      }
   }

   /* Encode significand */
   significand_high = 0,   /* The high 17 digits of the significand */
      significand_low = 0; /* The low 17 digits of the significand */

   if (significant_digits == 0) { /* read a zero */
      significand_high = 0;
      significand_low = 0;
   } else if (last_digit - first_digit < 17) {
      size_t d_idx = first_digit;
      significand_low = digits[d_idx++];

      for (; d_idx <= last_digit; d_idx++) {
         significand_low *= 10;
         significand_low += digits[d_idx];
         significand_high = 0;
      }
   } else {
      size_t d_idx = first_digit;
      significand_high = digits[d_idx++];

      for (; d_idx <= last_digit - 17; d_idx++) {
         significand_high *= 10;
         significand_high += digits[d_idx];
      }

      significand_low = digits[d_idx++];

      for (; d_idx <= last_digit; d_idx++) {
         significand_low *= 10;
         significand_low += digits[d_idx];
      }
   }

   _mul_64x64 (significand_high, 100000000000000000ull, &significand);
   significand.low += significand_low;

   if (significand.low < significand_low) {
      significand.high += 1;
   }


   biased_exponent = (exponent + (int16_t) BSON_DECIMAL128_EXPONENT_BIAS);

   /* Encode combination, exponent, and significand. */
   if ((significand.high >> 49) & 1) {
      /* Encode '11' into bits 1 to 3 */
      dec->high |= (0x3ull << 61);
      dec->high |= (biased_exponent & 0x3fffull) << 47;
      dec->high |= significand.high & 0x7fffffffffffull;
   } else {
      dec->high |= (biased_exponent & 0x3fffull) << 49;
      dec->high |= significand.high & 0x1ffffffffffffull;
   }

   dec->low = significand.low;

   /* Encode sign */
   if (is_negative) {
      dec->high |= 0x8000000000000000ull;
   }

   return true;
}